

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

optional<slang::SourceLocation> __thiscall slang::parsing::Trivia::getExplicitLocation(Trivia *this)

{
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar1;
  SourceLocation *in_RDI;
  optional<slang::SourceLocation> oVar2;
  Token *in_stack_00000018;
  undefined6 in_stack_ffffffffffffffc0;
  char cVar3;
  undefined1 in_stack_ffffffffffffffc7;
  _Storage<slang::SourceLocation,_true> in_stack_fffffffffffffff0;
  bool local_8;
  
  cVar3 = in_RDI[1].field_0x5;
  if (cVar3 == '\x06') {
    tokenLocationInclTrivia(in_stack_00000018);
    std::optional<slang::SourceLocation>::optional<slang::SourceLocation,_true>
              ((optional<slang::SourceLocation> *)
               CONCAT17(in_stack_ffffffffffffffc7,CONCAT16(cVar3,in_stack_ffffffffffffffc0)),in_RDI)
    ;
    uVar1 = extraout_RDX_00;
  }
  else if (cVar3 == '\a' || cVar3 == '\b') {
    slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)in_stack_fffffffffffffff0);
    tokenLocationInclTrivia(in_stack_00000018);
    std::optional<slang::SourceLocation>::optional<slang::SourceLocation,_true>
              ((optional<slang::SourceLocation> *)
               CONCAT17(in_stack_ffffffffffffffc7,CONCAT16(cVar3,in_stack_ffffffffffffffc0)),in_RDI)
    ;
    uVar1 = extraout_RDX;
  }
  else if ((in_RDI[1].field_0x4 & 1) == 0) {
    std::optional<slang::SourceLocation>::optional
              ((optional<slang::SourceLocation> *)&stack0xfffffffffffffff0);
    uVar1 = extraout_RDX_02;
  }
  else {
    std::optional<slang::SourceLocation>::optional<slang::SourceLocation_&,_true>
              ((optional<slang::SourceLocation> *)
               CONCAT17(in_stack_ffffffffffffffc7,CONCAT16(cVar3,in_stack_ffffffffffffffc0)),in_RDI)
    ;
    uVar1 = extraout_RDX_01;
  }
  oVar2.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceLocation>._9_7_ = (undefined7)((ulong)uVar1 >> 8);
  oVar2.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceLocation>._M_engaged = local_8;
  oVar2.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceLocation>._M_payload = in_stack_fffffffffffffff0;
  return (optional<slang::SourceLocation>)
         oVar2.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
         super__Optional_payload_base<slang::SourceLocation>;
}

Assistant:

std::optional<SourceLocation> Trivia::getExplicitLocation() const {
    switch (kind) {
        case TriviaKind::Directive:
        case TriviaKind::SkippedSyntax:
            return tokenLocationInclTrivia(syntaxNode->getFirstToken());
        case TriviaKind::SkippedTokens:
            SLANG_ASSERT(tokens.len);
            return tokenLocationInclTrivia(tokens.ptr[0]);
        default:
            if (hasFullLocation)
                return fullLocation->location;

            return std::nullopt;
    }
}